

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

void evutil_adjust_hints_for_addrconfig_(addrinfo *hints)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long *plVar4;
  socklen_t sin_out_len;
  sockaddr_in sin_out;
  sockaddr_in6 sin6_out;
  socklen_t local_80 [2];
  sockaddr local_78;
  undefined1 local_68 [20];
  undefined8 local_54;
  sockaddr local_48;
  undefined4 uStack_38;
  undefined8 uStack_34;
  sockaddr local_28;
  
  if (((hints->ai_flags & 0x20) != 0) && (hints->ai_family == 0)) {
    local_80[1] = 0x10;
    local_80[0] = 0x1c;
    if (have_checked_interfaces == '\0') {
      have_checked_interfaces = '\x01';
      local_68._0_2_ = 0;
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      iVar1 = getifaddrs();
      if (iVar1 < 0) {
        event_warn("Unable to call getifaddrs()");
        local_28.sa_data[2] = '\0';
        local_28.sa_data[3] = '\0';
        local_28.sa_data[4] = '\0';
        local_28.sa_data[5] = '\0';
        local_28.sa_data[6] = '\0';
        local_28.sa_data[7] = '\0';
        local_28.sa_data[8] = '\0';
        local_28.sa_data[9] = '\0';
        local_28.sa_data[10] = '\0';
        local_28.sa_data[0xb] = '\0';
        local_28.sa_data[0xc] = '\0';
        local_28.sa_data[0xd] = '\0';
        local_28.sa_family = 2;
        local_28.sa_data[0] = '\0';
        local_28.sa_data[1] = '5';
        iVar1 = evutil_inet_pton(2,"18.244.0.188",local_28.sa_data + 2);
        if (iVar1 == 0) {
          evutil_adjust_hints_for_addrconfig__cold_2();
LAB_001ee9e5:
          evutil_adjust_hints_for_addrconfig__cold_1();
        }
        local_68[4] = '\0';
        local_68[5] = '\0';
        local_68[6] = '\0';
        local_68[7] = '\0';
        local_68[8] = '\0';
        local_68[9] = '\0';
        local_68[10] = '\0';
        local_68[0xb] = '\0';
        local_68._12_8_ = 0;
        local_54 = 0;
        local_68._0_2_ = 10;
        local_68[2] = '\0';
        local_68[3] = '5';
        iVar1 = evutil_inet_pton(10,"2001:4860:b002::68",local_68 + 8);
        if (iVar1 == 0) goto LAB_001ee9e5;
        local_78.sa_family = 0;
        local_78.sa_data[0] = '\0';
        local_78.sa_data[1] = '\0';
        local_78.sa_data[2] = '\0';
        local_78.sa_data[3] = '\0';
        local_78.sa_data[4] = '\0';
        local_78.sa_data[5] = '\0';
        local_78.sa_data[6] = '\0';
        local_78.sa_data[7] = '\0';
        local_78.sa_data[8] = '\0';
        local_78.sa_data[9] = '\0';
        local_78.sa_data[10] = '\0';
        local_78.sa_data[0xb] = '\0';
        local_78.sa_data[0xc] = '\0';
        local_78.sa_data[0xd] = '\0';
        local_48.sa_family = 0;
        local_48.sa_data[0] = '\0';
        local_48.sa_data[1] = '\0';
        local_48.sa_data[2] = '\0';
        local_48.sa_data[3] = '\0';
        local_48.sa_data[4] = '\0';
        local_48.sa_data[5] = '\0';
        local_48.sa_data[6] = '\0';
        local_48.sa_data[7] = '\0';
        local_48.sa_data[8] = '\0';
        local_48.sa_data[9] = '\0';
        local_48.sa_data[10] = '\0';
        local_48.sa_data[0xb] = '\0';
        local_48.sa_data[0xc] = '\0';
        local_48.sa_data[0xd] = '\0';
        uStack_38 = 0;
        uStack_34 = 0;
        iVar1 = socket(2,2,0x11);
        if (-1 < iVar1) {
          iVar2 = connect(iVar1,&local_28,0x10);
          if (iVar2 == 0) {
            iVar2 = getsockname(iVar1,&local_78,local_80 + 1);
            if (iVar2 == 0) {
              evutil_found_ifaddr((sockaddr *)&local_78);
            }
          }
          close(iVar1);
        }
        iVar1 = socket(10,2,0x11);
        if (-1 < iVar1) {
          iVar2 = connect(iVar1,(sockaddr *)local_68,0x1c);
          if (iVar2 == 0) {
            iVar2 = getsockname(iVar1,&local_48,local_80);
            if (iVar2 == 0) {
              evutil_found_ifaddr((sockaddr *)&local_48);
            }
          }
          close(iVar1);
        }
      }
      else {
        plVar4 = (long *)CONCAT44(local_68._4_4_,local_68._0_4_);
        if (plVar4 == (long *)0x0) {
          uVar3 = 0;
        }
        else {
          do {
            if ((sockaddr *)plVar4[3] != (sockaddr *)0x0) {
              evutil_found_ifaddr((sockaddr *)plVar4[3]);
            }
            plVar4 = (long *)*plVar4;
          } while (plVar4 != (long *)0x0);
          uVar3 = CONCAT44(local_68._4_4_,local_68._0_4_);
        }
        freeifaddrs(uVar3);
      }
    }
    iVar1 = 2;
    if ((((had_ipv4_address ^ 1 | had_ipv6_address) & 1) == 0) ||
       (iVar1 = 10, ((had_ipv4_address ^ 1) & had_ipv6_address & 1) != 0)) {
      hints->ai_family = iVar1;
    }
  }
  return;
}

Assistant:

void
evutil_adjust_hints_for_addrconfig_(struct evutil_addrinfo *hints)
{
	if (!(hints->ai_flags & EVUTIL_AI_ADDRCONFIG))
		return;
	if (hints->ai_family != PF_UNSPEC)
		return;
	evutil_check_interfaces();
	if (had_ipv4_address && !had_ipv6_address) {
		hints->ai_family = PF_INET;
	} else if (!had_ipv4_address && had_ipv6_address) {
		hints->ai_family = PF_INET6;
	}
}